

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_de;
  allocator<char> local_dd;
  TestShaderType local_dc;
  SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *local_d8;
  string shader_source;
  string local_b0 [32];
  string example_struct;
  string local_70 [32];
  string local_50 [32];
  
  local_d8 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct,
             "struct light {\n    float[2] intensity;\n    int[2] position;\n};\n",
             (allocator<char> *)&shader_source);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  local_dc = tested_shader_type;
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"    light my_light_object",&local_dd)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"[2]",&local_de);
  (*(local_d8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_50,local_d8,local_b0,local_70,1);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_dc) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x594);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b8bcae::switchdataD_0172266c +
         (long)(int)(&switchD_00b8bcae::switchdataD_0172266c)[tested_shader_type]) {
  case 0xb8bcb0:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb8bcc1:
  case 0xb8bcc8:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01722684 + *(int *)(&DAT_01722684 + (ulong)tested_shader_type * 4)))
            (&DAT_01722684 + *(int *)(&DAT_01722684 + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void SizedDeclarationsStructTypes3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "};\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += this->extend_string("    light my_light_object", "[2]", max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}